

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

size_t get_max_body_write_len(Curl_easy *data,curl_off_t limit)

{
  curl_off_t remain_diff;
  curl_off_t limit_local;
  Curl_easy *data_local;
  
  if (limit == -1) {
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else {
    data_local = (Curl_easy *)(limit - (data->req).bytecount);
    if ((long)data_local < 0) {
      data_local = (Curl_easy *)0x0;
    }
  }
  return (size_t)data_local;
}

Assistant:

static size_t get_max_body_write_len(struct Curl_easy *data, curl_off_t limit)
{
  if(limit != -1) {
    /* How much more are we allowed to write? */
    curl_off_t remain_diff;
    remain_diff = limit - data->req.bytecount;
    if(remain_diff < 0) {
      /* already written too much! */
      return 0;
    }
#if SIZEOF_CURL_OFF_T > SIZEOF_SIZE_T
    else if(remain_diff > SSIZE_T_MAX) {
      return SIZE_T_MAX;
    }
#endif
    else {
      return (size_t)remain_diff;
    }
  }
  return SIZE_T_MAX;
}